

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::FractCase::compare(FractCase *this,void **inputs,void **outputs)

{
  Precision PVar1;
  int iVar2;
  pointer pSVar3;
  void *pvVar4;
  void *pvVar5;
  deUint32 aBits;
  uint uVar6;
  int iVar7;
  ostream *poVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  ostringstream *poVar12;
  float fVar13;
  ulong uVar14;
  deUint32 bBits;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  HexFloat local_3c;
  Hex<8UL> local_38;
  
  pSVar3 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar1 = (pSVar3->varType).m_data.basic.precision;
  uVar6 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  if (PVar1 - PRECISION_MEDIUMP < 2) {
    if ((int)uVar6 < 1) {
      return true;
    }
    pvVar4 = *inputs;
    pvVar5 = *outputs;
    uVar14 = 0;
    do {
      fVar16 = *(float *)((long)pvVar4 + uVar14 * 4);
      fVar15 = floorf(fVar16);
      fVar13 = *(float *)((long)pvVar5 + uVar14 * 4);
      local_3c.value = fVar16 - fVar15;
      if (PVar1 == PRECISION_HIGHP) {
LAB_014c8787:
        fVar15 = local_3c.value - (int)fVar13;
        if ((uint)local_3c.value < (uint)fVar13) {
          fVar15 = (float)-((int)local_3c.value - (int)fVar13);
        }
      }
      else if ((fVar13 != 0.0) || (NAN(fVar13))) {
        if ((local_3c.value != 0.0) || (NAN(local_3c.value))) goto LAB_014c8787;
        fVar15 = ABS(fVar13);
      }
      else {
        fVar15 = ABS(local_3c.value);
      }
      if (fVar15 != 0.0) {
        poVar12 = &(this->super_CommonFunctionCase).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar12->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10);
        poVar8 = (ostream *)std::ostream::operator<<(poVar12,(int)uVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] = ",4);
        poVar8 = Functional::operator<<(poVar8,&local_3c);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,", got ULP diff ",0xf);
LAB_014c8ad6:
        local_38.value._4_4_ = 0;
        local_38.value._0_4_ = fVar15;
        tcu::Format::Hex<8UL>::toStream(&local_38,poVar8);
        return false;
      }
      uVar14 = uVar14 + 1;
    } while (uVar6 != uVar14);
  }
  else {
    iVar2 = *(int *)(&DAT_01c9564c + (ulong)PVar1 * 4);
    bVar9 = 0x17 - (char)iVar2;
    if ((int)uVar6 < 1) {
      return true;
    }
    fVar16 = (float)((0x7fffffU >> (bVar9 & 0x1f)) << (bVar9 & 0x1f) ^ 0x3fffffff) + -1.0;
    pvVar4 = *inputs;
    pvVar5 = *outputs;
    uVar14 = 0;
    do {
      fVar15 = *(float *)((long)pvVar4 + uVar14 * 4);
      fVar13 = *(float *)((long)pvVar5 + uVar14 * 4);
      fVar17 = floorf(fVar15 - fVar16);
      fVar18 = floorf(fVar16 + fVar15);
      if ((int)fVar17 == (int)fVar18) {
        fVar17 = floorf(fVar15);
        local_3c.value = fVar15 - fVar17;
        iVar11 = ((uint)fVar15 >> 0x17 & 0xff) - 0x7f;
        iVar7 = iVar11;
        if (((uint)fVar15 & 0x7fffff) != 0) {
          iVar7 = -0x7e;
        }
        if (((uint)fVar15 & 0x7f800000) != 0) {
          iVar7 = iVar11;
        }
        iVar10 = ((uint)local_3c.value >> 0x17 & 0xff) - 0x7f;
        iVar11 = iVar10;
        if (((uint)local_3c.value & 0x7fffff) != 0) {
          iVar11 = -0x7e;
        }
        if (((uint)local_3c.value & 0x7f800000) != 0) {
          iVar11 = iVar10;
        }
        iVar7 = iVar7 - iVar11;
        if (iVar7 < 1) {
          iVar7 = 0;
        }
        iVar7 = iVar2 - iVar7;
        if (iVar7 < 1) {
          iVar7 = 0;
        }
        if ((fVar13 != 0.0) || (NAN(fVar13))) {
          if ((local_3c.value != 0.0) || (NAN(local_3c.value))) {
            fVar15 = local_3c.value - (int)fVar13;
            if ((uint)local_3c.value < (uint)fVar13) {
              fVar15 = (float)-((int)local_3c.value - (int)fVar13);
            }
          }
          else {
            fVar15 = ABS(fVar13);
          }
        }
        else {
          fVar15 = ABS(local_3c.value);
        }
        fVar13 = (float)~(-1 << (0x17U - (char)iVar7 & 0x1f));
        if ((uint)fVar13 < (uint)fVar15) {
          poVar12 = &(this->super_CommonFunctionCase).m_failMsg;
          std::__ostream_insert<char,std::char_traits<char>>
                    (&poVar12->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10);
          poVar8 = (ostream *)std::ostream::operator<<(poVar12,(int)uVar14);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] = ",4);
          poVar8 = Functional::operator<<(poVar8,&local_3c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," with ULP threshold ",0x14);
          local_38.value = (deUint64)(uint)fVar13;
          poVar8 = tcu::Format::Hex<8UL>::toStream(&local_38,poVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,", got diff ",0xb);
          goto LAB_014c8ad6;
        }
      }
      else if (1.0 <= fVar13) {
        poVar12 = &(this->super_CommonFunctionCase).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar12->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10);
        poVar8 = (ostream *)std::ostream::operator<<(poVar12,(int)uVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] < 1.0",7);
        return false;
      }
      uVar14 = uVar14 + 1;
    } while (uVar6 != uVar14);
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const bool				hasZeroSign		= supportsSignedZero(precision);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP || precision == glu::PRECISION_MEDIUMP)
		{
			// Require exact result.
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const float		ref			= deFloatFrac(in0);

				const deUint32	ulpDiff		= hasZeroSign ? getUlpDiff(out0, ref) : getUlpDiffIgnoreZeroSign(out0, ref);

				if (ulpDiff > 0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref) << ", got ULP diff " << tcu::toHex(ulpDiff);
					return false;
				}
			}
		}
		else
		{
			const int		mantissaBits	= getMinMantissaBits(precision);
			const float		eps				= getEpsFromBits(1.0f, mantissaBits);	// epsilon for rounding bounds

			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];

				if (int(deFloatFloor(in0-eps)) == int(deFloatFloor(in0+eps)))
				{
					const float		ref			= deFloatFrac(in0);
					const int		bitsLost	= numBitsLostInOp(in0, ref);
					const deUint32	maxUlpDiff	= getMaxUlpDiffFromBits(de::max(0, mantissaBits-bitsLost));	// ULP diff for rounded integer value.
					const deUint32	ulpDiff		= getUlpDiffIgnoreZeroSign(out0, ref);

					if (ulpDiff > maxUlpDiff)
					{
						m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref) << " with ULP threshold " << tcu::toHex(maxUlpDiff) << ", got diff " << tcu::toHex(ulpDiff);
						return false;
					}
				}
				else
				{
					if (out0 >= 1.0f)
					{
						m_failMsg << "Expected [" << compNdx << "] < 1.0";
						return false;
					}
				}
			}
		}

		return true;
	}